

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

void __thiscall kj::_::Mutex::unlock(Mutex *this,Exclusivity exclusivity,Waiter *waiterToSkip)

{
  uint uVar1;
  bool bVar2;
  Waiter *waiter_00;
  ulong in_stack_ffffffffffffff18;
  uint uVar3;
  uint local_bc;
  uint state;
  Fault f_1;
  DebugExpression<unsigned_int> local_80;
  uint local_7c;
  DebugExpression<unsigned_int> _kjCondition_1;
  uint oldState;
  uint expected;
  Waiter *waiter;
  Waiter *_waiter296;
  Maybe<kj::_::Mutex::Waiter_&> nextWaiter;
  Fault local_38;
  Fault f;
  DebugExpression<unsigned_int> local_24;
  Waiter *pWStack_20;
  DebugExpression<unsigned_int> _kjCondition;
  Waiter *waiterToSkip_local;
  Exclusivity exclusivity_local;
  Mutex *this_local;
  
  uVar3 = (uint)(in_stack_ffffffffffffff18 >> 0x20);
  pWStack_20 = waiterToSkip;
  if (exclusivity == EXCLUSIVE) {
    f.exception = (Exception *)
                  DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&_::MAGIC_ASSERT,&this->futex);
    local_24 = DebugExpression<unsigned_int&>::operator&
                         ((DebugExpression<unsigned_int&> *)&f,&EXCLUSIVE_HELD);
    bVar2 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_24);
    if (!bVar2) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<unsigned_int>&,char_const(&)[37]>
                (&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
                 ,0x11e,FAILED,"futex & EXCLUSIVE_HELD",
                 "_kjCondition,\"Unlocked a mutex that wasn\'t locked.\"",&local_24,
                 (char (*) [37])"Unlocked a mutex that wasn\'t locked.");
      Debug::Fault::fatal(&local_38);
    }
    Maybe<kj::_::Mutex::Waiter_&>::Maybe
              ((Maybe<kj::_::Mutex::Waiter_&> *)&_waiter296,&this->waitersHead);
    do {
      do {
        waiter_00 = readMaybe<kj::_::Mutex::Waiter>((Maybe<kj::_::Mutex::Waiter_&> *)&_waiter296);
        if (waiter_00 == (Waiter *)0x0) {
          _kjCondition_1.value = 0x3fffffff;
          local_bc = this->futex;
          do {
            LOCK();
            local_7c = this->futex;
            bVar2 = local_bc == local_7c;
            if (bVar2) {
              this->futex = local_bc & 0x3fffffff;
              local_7c = local_bc;
            }
            UNLOCK();
            local_bc = local_7c;
          } while (!bVar2);
          if ((local_7c & 0x7fffffff) == 0) {
            return;
          }
          syscall(0xca,this,0x81,0x7fffffff,0,0,in_stack_ffffffffffffff18 & 0xffffffff00000000);
          return;
        }
        Maybe<kj::_::Mutex::Waiter_&>::operator=
                  ((Maybe<kj::_::Mutex::Waiter_&> *)&_waiter296,&waiter_00->next);
      } while ((waiter_00 == pWStack_20) || (bVar2 = checkPredicate(this,waiter_00), !bVar2));
      if ((waiter_00->hasTimeout & 1U) == 0) {
        waiter_00->futex = 1;
        break;
      }
      LOCK();
      bVar2 = waiter_00->futex == 0;
      if (bVar2) {
        waiter_00->futex = 1;
      }
      UNLOCK();
    } while (!bVar2);
    syscall(0xca,&waiter_00->futex,0x81,0x7fffffff,0,0,
            in_stack_ffffffffffffff18 & 0xffffffff00000000);
  }
  else if (exclusivity == SHARED) {
    f_1.exception =
         (Exception *)
         DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&this->futex);
    local_80 = DebugExpression<unsigned_int&>::operator&
                         ((DebugExpression<unsigned_int&> *)&f_1,&SHARED_COUNT_MASK);
    bVar2 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_80);
    if (!bVar2) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<unsigned_int>&,char_const(&)[37]>
                ((Fault *)&stack0xffffffffffffff70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
                 ,0x170,FAILED,"futex & SHARED_COUNT_MASK",
                 "_kjCondition,\"Unshared a mutex that wasn\'t shared.\"",&local_80,
                 (char (*) [37])"Unshared a mutex that wasn\'t shared.");
      Debug::Fault::fatal((Fault *)&stack0xffffffffffffff70);
    }
    LOCK();
    uVar1 = this->futex;
    this->futex = this->futex - 1;
    UNLOCK();
    if (uVar1 == 0x40000001) {
      LOCK();
      bVar2 = this->futex == 0x40000000;
      if (bVar2) {
        this->futex = 0;
      }
      UNLOCK();
      if (bVar2) {
        syscall(0xca,this,0x81,0x7fffffff,0,0,(ulong)uVar3 << 0x20);
      }
    }
  }
  return;
}

Assistant:

void Mutex::unlock(Exclusivity exclusivity, Waiter* waiterToSkip) {
  switch (exclusivity) {
    case EXCLUSIVE: {
      KJ_DASSERT(futex & EXCLUSIVE_HELD, "Unlocked a mutex that wasn't locked.");

#ifdef KJ_CONTENTION_WARNING_THRESHOLD
      auto acquiredLocation = releasingExclusive();
#endif

      // First check if there are any conditional waiters. Note we only do this when unlocking an
      // exclusive lock since under a shared lock the state couldn't have changed.
      auto nextWaiter = waitersHead;
      for (;;) {
        KJ_IF_SOME(waiter, nextWaiter) {
          nextWaiter = waiter.next;

          if (&waiter != waiterToSkip && checkPredicate(waiter)) {
            // This waiter's predicate now evaluates true, so wake it up.
            if (waiter.hasTimeout) {
              // In this case we need to be careful to make sure the target thread isn't already
              // processing a timeout, so we need to do an atomic CAS rather than just a store.
              uint expected = 0;
              if (__atomic_compare_exchange_n(&waiter.futex, &expected, 1, false,
                                              __ATOMIC_RELEASE, __ATOMIC_RELAXED)) {
                // Good, we set it to 1, transferring ownership of the mutex. Continue on below.
              } else {
                // Looks like the thread already timed out and set its own futex to 1. In that
                // case it is going to try to lock the mutex itself, so we should NOT attempt an
                // ownership transfer as this will deadlock.
                //
                // We have two options here: We can continue along the waiter list looking for
                // another waiter that's ready to be signaled, or we could drop out of the list
                // immediately since we know that another thread is already waiting for the lock
                // and will re-evaluate the waiter queue itself when it is done. It feels cleaner
                // to me to continue.
                continue;
              }
            } else {
              __atomic_store_n(&waiter.futex, 1, __ATOMIC_RELEASE);
            }
            syscall(SYS_futex, &waiter.futex, FUTEX_WAKE_PRIVATE, INT_MAX, nullptr, nullptr, 0);

            // We transferred ownership of the lock to this waiter, so we're done now.
            return;
          }
        } else {
          // No more waiters.
          break;
        }
      }

#ifdef KJ_CONTENTION_WARNING_THRESHOLD
      uint readerCount;
      {
        uint oldState = __atomic_load_n(&futex, __ATOMIC_RELAXED);
        readerCount = oldState & SHARED_COUNT_MASK;
        if (readerCount >= KJ_CONTENTION_WARNING_THRESHOLD) {
          // Atomic not needed because we're still holding the exclusive lock.
          printContendedReader = true;
        }
      }
#endif

      // Didn't wake any waiters, so wake normally.
      uint oldState = __atomic_fetch_and(
          &futex, ~(EXCLUSIVE_HELD | EXCLUSIVE_REQUESTED), __ATOMIC_RELEASE);

      if (KJ_UNLIKELY(oldState & ~EXCLUSIVE_HELD)) {
        // Other threads are waiting.  If there are any shared waiters, they now collectively hold
        // the lock, and we must wake them up.  If there are any exclusive waiters, we must wake
        // them up even if readers are waiting so that at the very least they may re-establish the
        // EXCLUSIVE_REQUESTED bit that we just removed.
        syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, nullptr, nullptr, 0);

#ifdef KJ_CONTENTION_WARNING_THRESHOLD
        if (readerCount >= KJ_CONTENTION_WARNING_THRESHOLD) {
          KJ_LOG(WARNING, "excessively many readers were waiting on this lock", readerCount,
              acquiredLocation, kj::getStackTrace());
        }
#endif
      }
      break;
    }

    case SHARED: {
      KJ_DASSERT(futex & SHARED_COUNT_MASK, "Unshared a mutex that wasn't shared.");
      uint state = __atomic_sub_fetch(&futex, 1, __ATOMIC_RELEASE);

      // The only case where anyone is waiting is if EXCLUSIVE_REQUESTED is set, and the only time
      // it makes sense to wake up that waiter is if the shared count has reached zero.
      if (KJ_UNLIKELY(state == EXCLUSIVE_REQUESTED)) {
        if (__atomic_compare_exchange_n(
            &futex, &state, 0, false, __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
          // Wake all exclusive waiters.  We have to wake all of them because one of them will
          // grab the lock while the others will re-establish the exclusive-requested bit.
          syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, nullptr, nullptr, 0);
        }
      }
      break;
    }
  }